

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O1

void __thiscall
bk_lib::pod_vector<long,_std::allocator<long>_>::append_realloc
          (pod_vector<long,_std::allocator<long>_> *this,size_type n,long *x)

{
  size_type *psVar1;
  pointer plVar2;
  uint uVar3;
  long *__dest;
  uint uVar4;
  
  uVar4 = (this->ebo_).size + n;
  uVar3 = 2 << ((byte)uVar4 & 0x1f);
  if (3 < uVar4) {
    uVar3 = uVar4;
  }
  uVar4 = (this->ebo_).cap * 3 >> 1;
  if (uVar4 < uVar3) {
    uVar4 = uVar3;
  }
  __dest = __gnu_cxx::new_allocator<long>::allocate
                     ((new_allocator<long> *)this,(ulong)uVar4,(void *)0x0);
  plVar2 = (this->ebo_).buf;
  if (plVar2 != (pointer)0x0) {
    memcpy(__dest,plVar2,(ulong)(this->ebo_).size << 3);
  }
  detail::fill<long>(__dest + (this->ebo_).size,__dest + (this->ebo_).size + n,x);
  plVar2 = (this->ebo_).buf;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2);
  }
  (this->ebo_).buf = __dest;
  (this->ebo_).cap = uVar4;
  psVar1 = &(this->ebo_).size;
  *psVar1 = *psVar1 + n;
  return;
}

Assistant:

void append_realloc(size_type n, const T& x) {
		size_type new_cap = grow_size(n);
		pointer temp      = ebo_.allocate(new_cap);
		if (ebo_.buf) {
			std::memcpy(temp, ebo_.buf, size()*sizeof(T));
		}
		detail::fill(temp+size(), temp+size()+n, x);
		ebo_.release();
		ebo_.buf  = temp;
		ebo_.cap  = new_cap;
		ebo_.size+= n;
	}